

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O0

void * FIX::ThreadedSocketAcceptor::socketAcceptorThread(void *p)

{
  socket_handle s_00;
  bool bVar1;
  mapped_type *pmVar2;
  ThreadedSocketConnection *this;
  Log *pLVar3;
  Mutex *this_00;
  ostream *poVar4;
  char *pcVar5;
  bool bVar6;
  thread_id local_278;
  thread_id thread;
  stringstream local_250 [8];
  stringstream stream;
  ostream local_240 [376];
  Locker local_c8;
  Locker l;
  ConnectionThreadInfo *info_1;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> local_b0;
  ThreadedSocketConnection *local_70;
  ThreadedSocketConnection *pConnection;
  Sessions sessions;
  socket_handle socket;
  int rcvBufSize;
  int sendBufSize;
  int noDelay;
  int port;
  socket_handle s;
  ThreadedSocketAcceptor *pAcceptor;
  AcceptorThreadInfo *info;
  void *p_local;
  
  _port = *p;
  noDelay = *(int *)((long)p + 8);
  sendBufSize = *(int *)((long)p + 0xc);
  pAcceptor = (ThreadedSocketAcceptor *)p;
  info = (AcceptorThreadInfo *)p;
  if (p != (void *)0x0) {
    operator_delete(p,0x10);
  }
  rcvBufSize = 0;
  socket = 0;
  sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  socket_getsockopt(noDelay,1,&rcvBufSize);
  socket_getsockopt(noDelay,7,&socket);
  socket_getsockopt(noDelay,8,
                    (int *)((long)&sessions._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  while( true ) {
    bVar1 = Acceptor::isStopped(&_port->super_Acceptor);
    bVar6 = false;
    if (!bVar1) {
      sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = socket_accept(noDelay);
      bVar6 = (socket_handle)sessions._M_t._M_impl.super__Rb_tree_header._M_node_count != -1;
    }
    if (!bVar6) break;
    if (rcvBufSize != 0) {
      socket_setsockopt((socket_handle)sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,1);
    }
    if (socket != 0) {
      socket_setsockopt((socket_handle)sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,7,
                        socket);
    }
    if (sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0) {
      socket_setsockopt((socket_handle)sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,8,
                        sessions._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    }
    pmVar2 = std::
             map<int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
             ::operator[](&_port->m_portToSessions,&sendBufSize);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
               &pConnection,pmVar2);
    this = (ThreadedSocketConnection *)operator_new(0x20c8);
    s_00 = (socket_handle)sessions._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
              (&local_b0,
               (set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
               &pConnection);
    pLVar3 = Acceptor::getLog(&_port->super_Acceptor);
    ThreadedSocketConnection::ThreadedSocketConnection(this,s_00,&local_b0,pLVar3);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
              (&local_b0);
    local_70 = this;
    this_00 = (Mutex *)operator_new(0x10);
    ConnectionThreadInfo::ConnectionThreadInfo((ConnectionThreadInfo *)this_00,_port,local_70);
    l.m_mutex = this_00;
    Locker::Locker(&local_c8,&_port->m_mutex);
    std::__cxx11::stringstream::stringstream(local_250);
    poVar4 = std::operator<<(local_240,"Accepted connection from ");
    pcVar5 = socket_peername((socket_handle)
                             sessions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4," on port ");
    std::ostream::operator<<(poVar4,sendBufSize);
    pLVar3 = Acceptor::getLog(&_port->super_Acceptor);
    if (pLVar3 != (Log *)0x0) {
      pLVar3 = Acceptor::getLog(&_port->super_Acceptor);
      std::__cxx11::stringstream::str();
      (*pLVar3->_vptr_Log[6])(pLVar3,&thread);
      std::__cxx11::string::~string((string *)&thread);
    }
    bVar6 = thread_spawn(socketConnectionThread,l.m_mutex,&local_278);
    if (bVar6) {
      addThread(_port,(socket_handle)sessions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                local_278);
    }
    else {
      if (l.m_mutex != (Mutex *)0x0) {
        operator_delete(l.m_mutex,0x10);
      }
      if (local_70 != (ThreadedSocketConnection *)0x0) {
        (*(local_70->super_Responder)._vptr_Responder[1])();
      }
    }
    std::__cxx11::stringstream::~stringstream(local_250);
    Locker::~Locker(&local_c8);
    std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
              ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
               &pConnection);
  }
  bVar6 = Acceptor::isStopped(&_port->super_Acceptor);
  if (!bVar6) {
    removeThread(_port,noDelay);
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketAcceptor::socketAcceptorThread(void *p) {
  AcceptorThreadInfo *info = reinterpret_cast<AcceptorThreadInfo *>(p);

  ThreadedSocketAcceptor *pAcceptor = info->m_pAcceptor;
  socket_handle s = info->m_socket;
  int port = info->m_port;
  delete info;

  int noDelay = 0;
  int sendBufSize = 0;
  int rcvBufSize = 0;
  socket_getsockopt(s, TCP_NODELAY, noDelay);
  socket_getsockopt(s, SO_SNDBUF, sendBufSize);
  socket_getsockopt(s, SO_RCVBUF, rcvBufSize);

  socket_handle socket = 0;
  while ((!pAcceptor->isStopped() && (socket = socket_accept(s)) != INVALID_SOCKET_HANDLE)) {
    if (noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, sendBufSize);
    }
    if (rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, rcvBufSize);
    }

    Sessions sessions = pAcceptor->m_portToSessions[port];

    ThreadedSocketConnection *pConnection = new ThreadedSocketConnection(socket, sessions, pAcceptor->getLog());

    ConnectionThreadInfo *info = new ConnectionThreadInfo(pAcceptor, pConnection);

    {
      Locker l(pAcceptor->m_mutex);

      std::stringstream stream;
      stream << "Accepted connection from " << socket_peername(socket) << " on port " << port;

      if (pAcceptor->getLog()) {
        pAcceptor->getLog()->onEvent(stream.str());
      }

      thread_id thread;
      if (!thread_spawn(&socketConnectionThread, info, thread)) {
        delete info;
        delete pConnection;
      } else {
        pAcceptor->addThread(socket, thread);
      }
    }
  }

  if (!pAcceptor->isStopped()) {
    pAcceptor->removeThread(s);
  }

  return 0;
}